

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeLlvm.cpp
# Opt level: O0

LLVMValueRef CompileLlvmAssignment(LlvmCompilationContext *ctx,ExprAssignment *node)

{
  LLVMBuilderRef pLVar1;
  LLVMValueRef pLVar2;
  LLVMValueRef value;
  TypeBase *valueType;
  LLVMValueRef pLVar3;
  LLVMValueRef initializer;
  LLVMValueRef address;
  ExprAssignment *node_local;
  LlvmCompilationContext *ctx_local;
  
  pLVar2 = CompileLlvm(ctx,node->lhs);
  value = CompileLlvm(ctx,node->rhs);
  pLVar1 = ctx->builder;
  valueType = GetStackType(ctx,node->rhs->type);
  pLVar3 = ConvertToDataType(ctx,value,valueType,node->rhs->type);
  LLVMBuildStore(pLVar1,pLVar3,pLVar2);
  pLVar2 = CheckType(ctx,&node->super_ExprBase,value);
  return pLVar2;
}

Assistant:

LLVMValueRef CompileLlvmAssignment(LlvmCompilationContext &ctx, ExprAssignment *node)
{
	LLVMValueRef address = CompileLlvm(ctx, node->lhs);

	LLVMValueRef initializer = CompileLlvm(ctx, node->rhs);

	LLVMBuildStore(ctx.builder, ConvertToDataType(ctx, initializer, GetStackType(ctx, node->rhs->type), node->rhs->type), address);

	return CheckType(ctx, node, initializer);
}